

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Archive.cpp
# Opt level: O1

bool __thiscall ZAP::Archive::loadStream(Archive *this)

{
  bool bVar1;
  
  bVar1 = parseHeader(this);
  if (bVar1) {
    buildLookupTable(this);
  }
  else {
    if (this->stream != (istream *)0x0) {
      (**(code **)(*(long *)this->stream + 8))();
    }
    this->stream = (istream *)0x0;
    (this->header).magic = 0;
    (this->header).version = '\0';
    (this->header).compression = '\0';
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ZAP::Archive::Entry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ZAP::Archive::Entry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::clear(&(this->lookupTable)._M_h);
  }
  return bVar1;
}

Assistant:

bool Archive::loadStream()
	{
		if (!parseHeader())
		{
			close();
			return false;
		}
		else
		{
			buildLookupTable();
			return true;
		}
	}